

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2unum(long *val,char *str)

{
  ParameterError result;
  char *str_local;
  long *val_local;
  
  val_local._4_4_ = getnum(val,str,10);
  if (val_local._4_4_ == PARAM_OK) {
    if (*val < 0) {
      val_local._4_4_ = PARAM_NEGATIVE_NUMERIC;
    }
    else {
      val_local._4_4_ = PARAM_OK;
    }
  }
  return val_local._4_4_;
}

Assistant:

ParameterError str2unum(long *val, const char *str)
{
  ParameterError result = getnum(val, str, 10);
  if(result != PARAM_OK)
    return result;
  if(*val < 0)
    return PARAM_NEGATIVE_NUMERIC;

  return PARAM_OK;
}